

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildInfo.cpp
# Opt level: O3

string * jbcoin::BuildInfo::getVersionString_abi_cxx11_(void)

{
  int iVar1;
  void *in_RSI;
  string *__return_storage_ptr__;
  
  if (getVersionString[abi:cxx11]()::value_abi_cxx11_ == '\0') {
    __return_storage_ptr__ = (string *)&getVersionString[abi:cxx11]()::value_abi_cxx11_;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      getVersionString[abi:cxx11]()::$_0::operator()[abi_cxx11_(__return_storage_ptr__,in_RSI);
      __cxa_atexit(std::__cxx11::string::~string,&getVersionString[abi:cxx11]()::value_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getVersionString[abi:cxx11]()::value_abi_cxx11_);
    }
  }
  return &getVersionString[abi:cxx11]()::value_abi_cxx11_;
}

Assistant:

std::string const&
getVersionString ()
{
    static std::string const value = [] {
        std::string const s = versionString;
        beast::SemanticVersion v;
        if (!v.parse (s) || v.print () != s)
            LogicError (s + ": Bad server version string");
        return s;
    }();
    return value;
}